

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O1

RGBA tcu::anon_unknown_0::bilinearSampleRGBA8(ConstPixelBufferAccess *access,deUint32 u,deUint32 v)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  deUint32 fx0;
  uint uVar8;
  int iVar9;
  deUint32 fy0;
  int iVar10;
  
  uVar4 = u & 0xff;
  uVar5 = v & 0xff;
  pvVar3 = access->m_data;
  iVar9 = (access->m_pitch).m_data[1];
  uVar7 = iVar9 * (v >> 8);
  uVar6 = (ulong)(u >> 8);
  uVar1 = *(uint *)((long)pvVar3 + uVar6 * 4 + (ulong)uVar7);
  uVar7 = *(uint *)((long)pvVar3 + uVar6 * 4 + (ulong)uVar7 + 4);
  uVar8 = ((v >> 8) + 1) * iVar9;
  uVar2 = *(uint *)((long)pvVar3 + uVar6 * 4 + (ulong)uVar8);
  uVar8 = *(uint *)((long)pvVar3 + uVar6 * 4 + (ulong)uVar8 + 4);
  iVar9 = 0x100 - uVar4;
  iVar10 = 0x100 - uVar5;
  return (RGBA)((((uVar2 >> 0x18) * uVar5 + (uVar1 >> 0x18) * iVar10) * iVar9 +
                ((uVar8 >> 0x18) * uVar5 + (uVar7 >> 0x18) * iVar10) * uVar4) * 0x100 + 0x800000 &
                0xff000000 |
                ((uVar2 >> 0x10 & 0xff) * uVar5 + (uVar1 >> 0x10 & 0xff) * iVar10) * iVar9 +
                ((uVar8 >> 0x10 & 0xff) * uVar5 + (uVar7 >> 0x10 & 0xff) * iVar10) * uVar4 + 0x8000
                & 0xff0000 |
                ((uVar2 & 0xff) * uVar5 + (uVar1 & 0xff) * iVar10) * iVar9 +
                ((uVar8 & 0xff) * uVar5 + (uVar7 & 0xff) * iVar10) * uVar4 + 0x8000 >> 0x10 & 0xff |
               ((uVar2 >> 8 & 0xff) * uVar5 + (uVar1 >> 8 & 0xff) * iVar10) * iVar9 +
               ((uVar8 >> 8 & 0xff) * uVar5 + (uVar7 >> 8 & 0xff) * iVar10) * uVar4 + 0x8000 >> 8 &
               0xff00);
}

Assistant:

RGBA bilinearSampleRGBA8 (const ConstPixelBufferAccess& access, deUint32 u, deUint32 v)
{
	deUint32	x0		= u>>NUM_SUBPIXEL_BITS;
	deUint32	y0		= v>>NUM_SUBPIXEL_BITS;
	deUint32	x1		= x0+1; //de::min(x0+1, (deUint32)(access.getWidth()-1));
	deUint32	y1		= y0+1; //de::min(y0+1, (deUint32)(access.getHeight()-1));

	DE_ASSERT(x1 < (deUint32)access.getWidth());
	DE_ASSERT(y1 < (deUint32)access.getHeight());

	deUint32	fx1		= u-(x0<<NUM_SUBPIXEL_BITS);
	deUint32	fy1		= v-(y0<<NUM_SUBPIXEL_BITS);

	deUint32	p00		= readRGBA8Raw(access, x0, y0);
	deUint32	p10		= readRGBA8Raw(access, x1, y0);
	deUint32	p01		= readRGBA8Raw(access, x0, y1);
	deUint32	p11		= readRGBA8Raw(access, x1, y1);

	deUint32	res		= 0;

	res |= interpolateChannel(fx1, fy1, getChannel<0>(p00), getChannel<0>(p01), getChannel<0>(p10), getChannel<0>(p11)) << RGBA::RED_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<1>(p00), getChannel<1>(p01), getChannel<1>(p10), getChannel<1>(p11)) << RGBA::GREEN_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<2>(p00), getChannel<2>(p01), getChannel<2>(p10), getChannel<2>(p11)) << RGBA::BLUE_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<3>(p00), getChannel<3>(p01), getChannel<3>(p10), getChannel<3>(p11)) << RGBA::ALPHA_SHIFT;

	return RGBA(res);
}